

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  u8 uVar1;
  long lVar2;
  Fts5ExprNearset *pFVar3;
  Fts5ExprPhrase *pFVar4;
  Fts5IndexIter *pFVar5;
  u8 *puVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  i64 iVar11;
  i64 iVar12;
  i64 iVar13;
  Fts5NearTrimmer *pFVar14;
  ulong uVar15;
  Fts5ExprTerm *pFVar16;
  long lVar17;
  Fts5NearTrimmer *pFVar18;
  Fts5ExprTerm *pFVar19;
  i64 *piVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  Fts5PoslistWriter *pWriter;
  i64 iLast;
  i64 *piVar24;
  ulong uVar25;
  long in_FS_OFFSET;
  bool bVar26;
  int local_12c;
  Fts5Buffer local_128;
  u8 *a;
  int n;
  Fts5PoslistWriter writer;
  Fts5NearTrimmer aStatic [4];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = pNode->pNear;
  pFVar4 = pFVar3->apPhrase[0];
  iVar10 = pExpr->bDesc;
  if (pFVar4->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    iVar11 = (pFVar4->aTerm[0].pIter)->iRowid;
  }
  else {
    iVar11 = fts5ExprSynonymRowid(pFVar4->aTerm,iVar10,(int *)0x0);
  }
  lVar22 = 0;
  bVar26 = true;
  do {
    bVar7 = bVar26;
    while (bVar26 = bVar7, pFVar3->nPhrase <= lVar22) {
      lVar22 = 0;
      bVar7 = true;
      if (bVar26) {
        pNode->iRowid = iVar11;
        pFVar3 = pNode->pNear;
        local_12c = 0;
        if (pExpr->pConfig->eDetail != 0) {
          pFVar4 = pFVar3->apPhrase[0];
          (pFVar4->poslist).n = 0;
          iVar8 = 0;
          bVar26 = false;
          for (pFVar16 = pFVar4->aTerm; pFVar16 != (Fts5ExprTerm *)0x0; pFVar16 = pFVar16->pSynonym)
          {
            pFVar5 = pFVar16->pIter;
            if (((pFVar5->bEof == '\0') && (pFVar5->iRowid == iVar11)) && (0 < pFVar5->nData)) {
              (pFVar4->poslist).n = 1;
              bVar26 = true;
            }
          }
          goto LAB_001c652e;
        }
        uVar25 = 0;
        goto LAB_001c6027;
      }
    }
    pFVar4 = pFVar3->apPhrase[lVar22];
    for (lVar17 = 0; lVar17 < pFVar4->nTerm; lVar17 = lVar17 + 1) {
      pFVar16 = pFVar4->aTerm + lVar17;
      iVar13 = iVar11;
      if (pFVar4->aTerm[lVar17].pSynonym == (Fts5ExprTerm *)0x0) {
        pFVar5 = pFVar16->pIter;
        lVar23 = pFVar5->iRowid;
        if (lVar23 != iVar11) {
          bVar26 = false;
          if ((iVar10 == 0 && lVar23 < iVar11) || (iVar13 = lVar23, iVar10 != 0 && iVar11 < lVar23))
          {
            iVar8 = sqlite3Fts5IterNextFrom(pFVar5,iVar11);
            if ((iVar8 != 0) || (pFVar5->bEof != '\0')) {
              pNode->bEof = 1;
              goto LAB_001c653e;
            }
            iVar13 = pFVar5->iRowid;
LAB_001c5f9f:
            bVar26 = false;
          }
        }
      }
      else {
        iVar12 = fts5ExprSynonymRowid(pFVar16,iVar10,(int *)0x0);
        if (iVar12 != iVar11) {
          aStatic[0].reader.a = (u8 *)((ulong)aStatic[0].reader.a & 0xffffffff00000000);
          iVar8 = 0;
          for (pFVar19 = pFVar16; (iVar8 == 0 && (pFVar19 != (Fts5ExprTerm *)0x0));
              pFVar19 = pFVar19->pSynonym) {
            pFVar5 = pFVar19->pIter;
            iVar8 = 0;
            if (pFVar5->bEof == '\0') {
              if ((iVar10 == 0 && pFVar5->iRowid < iVar11) ||
                 (iVar10 != 0 && iVar11 < pFVar5->iRowid)) {
                iVar8 = sqlite3Fts5IterNextFrom(pFVar5,iVar11);
              }
            }
          }
          if (iVar8 == 0) {
            iVar13 = fts5ExprSynonymRowid(pFVar16,iVar10,(int *)aStatic);
            if ((int)aStatic[0].reader.a == 0) goto LAB_001c5f9f;
          }
          pNode->bEof = 1;
          pNode->bNomatch = 0;
          goto LAB_001c653e;
        }
      }
      iVar11 = iVar13;
    }
    lVar22 = lVar22 + 1;
  } while( true );
LAB_001c6027:
  iVar8 = local_12c;
  if (local_12c == 0) {
    if ((long)pFVar3->nPhrase <= (long)uVar25) {
      iVar8 = 0;
      goto LAB_001c6327;
    }
    pFVar4 = pFVar3->apPhrase[uVar25];
    iVar10 = pFVar4->nTerm;
    if ((((long)iVar10 < 2) && (pFVar4->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) &&
       ((pFVar3->pColset == (Fts5Colset *)0x0 && (pFVar4->aTerm[0].bFirst == '\0')))) {
      pFVar5 = pFVar4->aTerm[0].pIter;
      sqlite3Fts5BufferSet(&local_12c,&pFVar4->poslist,pFVar5->nData,pFVar5->pData);
      goto LAB_001c62c0;
    }
    writer.iPrev = 0;
    uVar1 = pFVar4->aTerm[0].bFirst;
    (pFVar4->poslist).n = 0;
    pFVar14 = aStatic;
    if (4 < iVar10) {
      pFVar14 = (Fts5NearTrimmer *)sqlite3_malloc64((long)iVar10 << 5);
      if (pFVar14 == (Fts5NearTrimmer *)0x0) {
        local_12c = 7;
        iVar8 = 7;
        goto LAB_001c6327;
      }
      iVar10 = pFVar4->nTerm;
    }
    pFVar16 = pFVar4->aTerm;
    aStatic[2].reader.iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[2].reader.iLookahead = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[2].reader.a = &DAT_aaaaaaaaaaaaaaaa;
    aStatic[2].reader._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStatic[1].writer.iPrev = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[1].pOut = (Fts5Buffer *)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[1].reader.iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[1].reader.iLookahead = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[1].reader.a = &DAT_aaaaaaaaaaaaaaaa;
    aStatic[1].reader._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStatic[0].writer.iPrev = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[0].pOut = (Fts5Buffer *)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[0].reader.iPos = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[0].reader.iLookahead = (i64)&DAT_aaaaaaaaaaaaaaaa;
    aStatic[0].reader.a = &DAT_aaaaaaaaaaaaaaaa;
    aStatic[0].reader._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    memset(pFVar14,0,(long)iVar10 << 5);
    lVar22 = 0;
    pFVar18 = pFVar14;
    do {
      uVar15 = (ulong)pFVar4->nTerm;
      if ((long)uVar15 <= lVar22) {
LAB_001c61a8:
        bVar26 = true;
        uVar21 = (pFVar14->reader).iLookahead;
        lVar22 = 0;
        do {
          bVar7 = bVar26;
          while (bVar26 = bVar7, (int)uVar15 <= lVar22) {
            lVar22 = 0;
            bVar7 = true;
            if (bVar26) {
              if (((uVar1 == '\0') || ((uVar21 & 0x7fffffff) == 0)) &&
                 (iVar8 = sqlite3Fts5PoslistWriterAppend(&pFVar4->poslist,&writer,uVar21),
                 iVar8 != 0)) goto LAB_001c626f;
              lVar22 = -1;
              pFVar18 = pFVar14;
              goto LAB_001c6242;
            }
          }
          lVar17 = uVar21 + lVar22;
          if ((&pFVar14->reader)[lVar22].iLookahead != lVar17) {
            while (lVar23 = ((Fts5PoslistReader *)(&pFVar14->reader + lVar22))->iPos,
                  lVar23 < lVar17) {
              iVar10 = sqlite3Fts5PoslistReaderNext
                                 ((Fts5PoslistReader *)(&pFVar14->reader + lVar22));
              if (iVar10 != 0) goto LAB_001c6262;
            }
            if (lVar17 < lVar23) {
              uVar21 = lVar23 - lVar22;
            }
            uVar15 = (ulong)(uint)pFVar4->nTerm;
            bVar26 = false;
          }
          lVar22 = lVar22 + 1;
        } while( true );
      }
      n = 0;
      a = (u8 *)0x0;
      if (pFVar16->pSynonym == (Fts5ExprTerm *)0x0) {
        a = pFVar16->pIter->pData;
        n = pFVar16->pIter->nData;
        bVar26 = false;
      }
      else {
        local_128.p = (u8 *)0x0;
        local_128.n = 0;
        local_128.nSpace = 0;
        iVar8 = fts5ExprSynonymList(pFVar16,pNode->iRowid,&local_128,&a,&n);
        if (iVar8 != 0) {
          sqlite3_free(a);
          goto LAB_001c626f;
        }
        bVar26 = a == local_128.p;
      }
      sqlite3Fts5PoslistReaderInit(a,n,(Fts5PoslistReader *)pFVar18);
      *(bool *)&(pFVar18->reader).iPos = bVar26;
      if (*(u8 *)((long)&(pFVar18->reader).iPos + 1) != '\0') goto LAB_001c6262;
      lVar22 = lVar22 + 1;
      pFVar18 = (Fts5NearTrimmer *)&pFVar18->writer;
      pFVar16 = pFVar16 + 1;
    } while( true );
  }
  goto LAB_001c6327;
LAB_001c6242:
  uVar15 = (ulong)pFVar4->nTerm;
  lVar22 = lVar22 + 1;
  if ((long)uVar15 <= lVar22) goto LAB_001c61a8;
  iVar10 = sqlite3Fts5PoslistReaderNext((Fts5PoslistReader *)pFVar18);
  pFVar18 = (Fts5NearTrimmer *)&pFVar18->writer;
  if (iVar10 != 0) goto LAB_001c6262;
  goto LAB_001c6242;
LAB_001c6262:
  iVar8 = 0;
LAB_001c626f:
  iVar10 = (pFVar4->poslist).n;
  piVar24 = &(pFVar14->reader).iPos;
  for (lVar22 = 0; lVar22 < pFVar4->nTerm; lVar22 = lVar22 + 1) {
    if ((u8)*piVar24 != '\0') {
      sqlite3_free(((Fts5PoslistReader *)(piVar24 + -2))->a);
    }
    piVar24 = piVar24 + 4;
  }
  if (pFVar14 != aStatic) {
    sqlite3_free(pFVar14);
  }
  local_12c = iVar8;
  if (iVar10 < 1) goto LAB_001c6327;
LAB_001c62c0:
  uVar25 = uVar25 + 1;
  goto LAB_001c6027;
LAB_001c6432:
  lVar23 = iVar11 - ((long)pFVar3->nNear + (long)pFVar3->apPhrase[lVar22]->nTerm);
  lVar17 = pFVar14[lVar22].reader.iPos;
  if ((iVar11 < lVar17) || (lVar17 < lVar23)) {
    while (lVar17 = pFVar14[lVar22].reader.iPos, lVar17 < lVar23) {
      iVar10 = fts5LookaheadReaderNext(&pFVar14[lVar22].reader);
      if (iVar10 != 0) goto LAB_001c6506;
    }
    if (iVar11 < lVar17) {
      iVar11 = lVar17;
    }
    bVar26 = false;
  }
  lVar22 = lVar22 + 1;
  goto LAB_001c6418;
LAB_001c6506:
  iVar10 = pFVar14->pOut->n;
  iVar8 = (int)local_128.p;
  if (pFVar14 != aStatic) {
    sqlite3_free(pFVar14);
  }
  bVar26 = 0 < iVar10;
  goto LAB_001c652e;
LAB_001c6327:
  bVar26 = false;
  if (pFVar3->nPhrase == (int)uVar25) {
    if (uVar25 == 1) {
      bVar26 = true;
    }
    else {
      pFVar14 = aStatic;
      memset(pFVar14,0xaa,0xc0);
      local_128.p = (u8 *)CONCAT44(local_128.p._4_4_,iVar8);
      if (uVar25 < 5) {
        memset(pFVar14,0,0xc0);
      }
      else {
        pFVar14 = (Fts5NearTrimmer *)
                  sqlite3Fts5MallocZero((int *)&local_128,(uVar25 & 0xffffffff) * 0x30);
        iVar8 = (int)local_128.p;
      }
      if (iVar8 == 0) {
        pFVar18 = pFVar14;
        for (lVar22 = 0; lVar22 < pFVar3->nPhrase; lVar22 = lVar22 + 1) {
          pFVar4 = pFVar3->apPhrase[lVar22];
          puVar6 = (pFVar4->poslist).p;
          iVar10 = (pFVar4->poslist).n;
          (pFVar18->reader).a = (u8 *)0x0;
          (pFVar18->reader).n = 0;
          (pFVar18->reader).i = 0;
          (pFVar18->reader).iPos = 0;
          (pFVar18->reader).iLookahead = 0;
          (pFVar18->reader).a = puVar6;
          (pFVar18->reader).n = iVar10;
          fts5LookaheadReaderNext(&pFVar18->reader);
          fts5LookaheadReaderNext(&pFVar18->reader);
          (pFVar4->poslist).n = 0;
          pFVar18->pOut = &pFVar4->poslist;
          pFVar18 = pFVar18 + 1;
        }
        piVar24 = &(pFVar14->reader).iLookahead;
        do {
          iVar11 = (pFVar14->reader).iPos;
          lVar22 = 0;
          bVar26 = true;
LAB_001c6418:
          uVar9 = pFVar3->nPhrase;
          do {
            if (lVar22 < (int)uVar9) goto LAB_001c6432;
            lVar22 = 0;
            bVar7 = !bVar26;
            bVar26 = true;
          } while (bVar7);
          pWriter = &pFVar14->writer;
          for (lVar22 = 0; lVar22 < (int)uVar9; lVar22 = lVar22 + 1) {
            if (((*(Fts5Buffer **)(pWriter + 1))->n == 0) || (pWriter[-2].iPrev != pWriter->iPrev))
            {
              sqlite3Fts5PoslistWriterAppend
                        (*(Fts5Buffer **)(pWriter + 1),pWriter,pWriter[-2].iPrev);
              uVar9 = pFVar3->nPhrase;
            }
            pWriter = pWriter + 6;
          }
          lVar22 = *piVar24;
          uVar15 = 0;
          uVar25 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar25 = uVar15;
          }
          uVar21 = 0;
          piVar20 = piVar24;
          for (; uVar25 != uVar15; uVar15 = uVar15 + 1) {
            if (*piVar20 < lVar22) {
              uVar21 = uVar15 & 0xffffffff;
              lVar22 = *piVar20;
            }
            piVar20 = piVar20 + 6;
          }
          iVar10 = fts5LookaheadReaderNext(&pFVar14[(int)uVar21].reader);
          if (iVar10 != 0) goto LAB_001c6506;
        } while( true );
      }
    }
  }
LAB_001c652e:
  pNode->bNomatch = (uint)(!bVar26 && iVar8 == 0);
LAB_001c653e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1
       || pNear->apPhrase[0]->nTerm>1
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}